

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGTextElement::boundingBox(SVGTextElement *this,bool includeStroke)

{
  float fVar1;
  float fVar2;
  pointer pSVar3;
  SVGTextPositioningElement *pSVar4;
  Rect RVar5;
  bool bVar6;
  SVGTextFragment *fragment;
  pointer pSVar7;
  Rect boundingBox;
  Rect fragmentRect;
  Transform fragmentTranform;
  Rect local_88;
  Rect local_70;
  Rect local_58;
  Transform local_48;
  
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.w = -1.0;
  local_88.h = -1.0;
  pSVar3 = (this->m_fragments).
           super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar7 = (this->m_fragments).
                super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar3; pSVar7 = pSVar7 + 1) {
    pSVar4 = pSVar7->element;
    Transform::rotated((Transform *)&local_70,pSVar7->angle,pSVar7->x,pSVar7->y);
    Transform::operator*(&local_48,(Transform *)&local_70,&pSVar7->lengthAdjustTransform);
    fVar1 = pSVar7->x;
    fVar2 = pSVar7->y;
    local_70.y = Font::ascent(&pSVar4->m_font);
    local_70.y = fVar2 - local_70.y;
    local_70.w = pSVar7->width;
    local_70.h = (pSVar7->element->super_SVGGraphicsElement).super_SVGElement.m_font_size;
    local_70.x = fVar1;
    if (includeStroke) {
      bVar6 = SVGPaintServer::isRenderable(&pSVar4->m_stroke);
      if (bVar6) {
        Rect::inflate(&local_70,pSVar7->element->m_stroke_width * 0.5);
      }
    }
    local_58 = Transform::mapRect(&local_48,&local_70);
    Rect::unite(&local_88,&local_58);
  }
  if ((local_88.w < 0.0) || (local_88.h < 0.0)) {
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.w = 0.0;
    local_88.h = 0.0;
  }
  RVar5.w = local_88.w;
  RVar5.x = local_88.x;
  RVar5.y = local_88.y;
  RVar5.h = local_88.h;
  return RVar5;
}

Assistant:

Rect SVGTextElement::boundingBox(bool includeStroke) const
{
    auto boundingBox = Rect::Invalid;
    for(const auto& fragment : m_fragments) {
        const auto& font = fragment.element->font();
        const auto& stroke = fragment.element->stroke();
        auto fragmentTranform = Transform::rotated(fragment.angle, fragment.x, fragment.y) * fragment.lengthAdjustTransform;
        auto fragmentRect = Rect(fragment.x, fragment.y - font.ascent(), fragment.width, fragment.element->font_size());
        if(includeStroke && stroke.isRenderable())
            fragmentRect.inflate(fragment.element->stroke_width() / 2.f);
        boundingBox.unite(fragmentTranform.mapRect(fragmentRect));
    }

    if(!boundingBox.isValid())
        boundingBox = Rect::Empty;
    return boundingBox;
}